

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::EndTable(void)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  ImVec4 *pIVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  char cVar8;
  short sVar9;
  ImGuiTable *pIVar10;
  ImGuiWindow *window;
  ImGuiWindow *pIVar11;
  ImDrawListSplitter *this;
  ulong uVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  int iVar15;
  ImGuiTableInstanceData *pIVar16;
  long lVar17;
  ImGuiTableTempData *pIVar18;
  char *pcVar19;
  ImGuiTableColumn *pIVar20;
  ImDrawList *draw_list;
  ImGuiTableColumn *column;
  ImGuiTable *p;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  uint extraout_XMM0_Db;
  uint uVar25;
  uint extraout_XMM0_Dc;
  uint uVar26;
  uint extraout_XMM0_Dd;
  uint uVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  uint uVar33;
  uint uVar34;
  ImVec2 local_38;
  
  pIVar13 = GImGui;
  pIVar10 = GImGui->CurrentTable;
  if (pIVar10 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4b4,"void ImGui::EndTable()");
  }
  if (pIVar10->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar10);
  }
  window = pIVar10->InnerWindow;
  if (window != pIVar13->CurrentWindow) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4c3,"void ImGui::EndTable()");
  }
  uVar33 = pIVar10->Flags;
  pIVar11 = pIVar10->OuterWindow;
  pIVar18 = pIVar10->TempData;
  if ((pIVar11 != window) && (pIVar11 != window->ParentWindow)) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4c4,"void ImGui::EndTable()");
  }
  if (pIVar10->IsInsideRow == true) {
    TableEndRow(pIVar10);
  }
  if (((((uVar33 & 0x20) != 0) && (pIVar10->HoveredColumnBody != -1)) &&
      (bVar14 = IsAnyItemHovered(), !bVar14)) && (bVar14 = IsMouseReleased(1), bVar14)) {
    TableOpenContextMenu((int)pIVar10->HoveredColumnBody);
  }
  sVar9 = pIVar10->InstanceCurrent;
  if (sVar9 == 0) {
    pIVar16 = &pIVar10->InstanceDataFirst;
  }
  else {
    if ((sVar9 < 1) || ((pIVar10->InstanceDataExtra).Size < (int)sVar9)) {
      pcVar19 = "T &ImVector<ImGuiTableInstanceData>::operator[](int) [T = ImGuiTableInstanceData]";
      goto LAB_00196a3e;
    }
    pIVar16 = (pIVar10->InstanceDataExtra).Data + ((ulong)(uint)(int)sVar9 - 1);
  }
  (window->DC).PrevLineSize = pIVar18->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar18->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar18->HostBackupCursorMaxPos;
  fVar4 = pIVar10->RowPosY2;
  pfVar1 = &(window->DC).CursorPos.y;
  if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4d4,"void ImGui::EndTable()");
  }
  if (pIVar11 == window) {
    if ((uVar33 >> 0x11 & 1) == 0) {
      fVar32 = (pIVar10->OuterRect).Max.y;
      uVar22 = -(uint)(fVar4 <= fVar32);
      fVar32 = (float)(~uVar22 & (uint)fVar4 | (uint)fVar32 & uVar22);
      (pIVar10->InnerRect).Max.y = fVar32;
      (pIVar10->OuterRect).Max.y = fVar32;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar4;
  }
  fVar32 = (pIVar10->OuterRect).Max.y;
  fVar29 = (pIVar10->WorkRect).Max.y;
  uVar22 = -(uint)(fVar32 <= fVar29);
  (pIVar10->WorkRect).Max.y = (float)(~uVar22 & (uint)fVar32 | (uint)fVar29 & uVar22);
  pIVar16->LastOuterHeight = fVar32 - (pIVar10->OuterRect).Min.y;
  if (((uint)pIVar10->Flags >> 0x18 & 1) != 0) {
    fVar32 = (pIVar10->InnerWindow->DC).CursorMaxPos.x;
    cVar8 = pIVar10->RightMostEnabledColumn;
    if ((long)cVar8 != -1) {
      if ((cVar8 < '\0') ||
         (pIVar20 = (pIVar10->Columns).Data + cVar8, (pIVar10->Columns).DataEnd <= pIVar20))
      goto LAB_0019688f;
      fVar29 = 0.0;
      if (((uint)pIVar10->Flags >> 10 & 1) != 0) {
        fVar29 = 1.0;
      }
      fVar29 = (pIVar20->WorkMaxX + pIVar10->CellPaddingX + pIVar10->OuterPaddingX) - fVar29;
      uVar22 = -(uint)(fVar29 <= fVar32);
      fVar32 = (float)(uVar22 & (uint)fVar32 | ~uVar22 & (uint)fVar29);
    }
    if (pIVar10->ResizedColumn != -1) {
      uVar22 = -(uint)(pIVar10->ResizeLockMinContentsX2 <= fVar32);
      fVar32 = (float)((uint)fVar32 & uVar22 | ~uVar22 & (uint)pIVar10->ResizeLockMinContentsX2);
    }
    (pIVar10->InnerWindow->DC).CursorMaxPos.x = fVar32;
  }
  if ((uVar33 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  draw_list = window->DrawList;
  lVar17 = (long)(draw_list->_ClipRectStack).Size;
  if (lVar17 < 1) {
    pcVar19 = "T &ImVector<ImVec4>::back() [T = ImVec4]";
    goto LAB_00196956;
  }
  pIVar3 = (draw_list->_ClipRectStack).Data + lVar17 + -1;
  fVar32 = pIVar3->y;
  fVar29 = pIVar3->z;
  fVar31 = pIVar3->w;
  (window->ClipRect).Min.x = pIVar3->x;
  (window->ClipRect).Min.y = fVar32;
  (window->ClipRect).Max.x = fVar29;
  (window->ClipRect).Max.y = fVar31;
  if ((uVar33 & 0x780) != 0) {
    TableDrawBorders(pIVar10);
    draw_list = window->DrawList;
  }
  this = pIVar10->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this,draw_list,0);
  if ((pIVar10->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar10);
  }
  ImDrawListSplitter::Merge(this,window->DrawList);
  iVar15 = pIVar10->ColumnsCount;
  if ((long)iVar15 < 1) {
    fVar32 = 0.0;
    fVar29 = 0.0;
    fVar31 = 0.0;
  }
  else {
    uVar12 = pIVar10->EnabledMaskByIndex;
    fVar31 = 0.0;
    lVar17 = 0x18;
    uVar21 = 0;
    fVar29 = 0.0;
    fVar32 = 0.0;
    uVar33 = 0;
    uVar22 = 0;
    uVar34 = 0;
    do {
      if ((uVar12 >> (uVar21 & 0x3f) & 1) != 0) {
        pIVar20 = (pIVar10->Columns).Data;
        column = (ImGuiTableColumn *)((long)pIVar20 + lVar17 + -0x18);
        if ((pIVar10->Columns).DataEnd <= column) goto LAB_0019688f;
        uVar23 = column->Flags;
        if ((uVar23 & 0x30) == 0x10) {
          fVar24 = *(float *)((long)pIVar20 + lVar17 + -8);
          uVar25 = 0;
          uVar26 = 0;
          uVar27 = 0;
        }
        else {
          fVar24 = TableGetColumnWidthAuto(pIVar10,column);
          uVar25 = extraout_XMM0_Db;
          uVar26 = extraout_XMM0_Dc;
          uVar27 = extraout_XMM0_Dd;
        }
        if ((uVar23 & 0x10) == 0) {
          fVar29 = fVar29 + fVar24;
        }
        else {
          fVar31 = fVar31 + fVar24;
        }
        if ((~uVar23 & 0x28) == 0) {
          fVar24 = fVar24 / (*(float *)((long)&pIVar20->Flags + lVar17) /
                            pIVar10->ColumnsStretchSumWeights);
          uVar23 = -(uint)(fVar24 <= fVar32);
          auVar28._0_4_ = uVar23 & (uint)fVar32;
          auVar28._4_4_ = uVar25 & uVar33;
          auVar28._8_4_ = uVar26 & uVar22;
          auVar28._12_4_ = uVar27 & uVar34;
          auVar28 = auVar28 | ZEXT416(~uVar23 & (uint)fVar24);
          fVar32 = auVar28._0_4_;
          uVar33 = auVar28._4_4_;
          uVar22 = auVar28._8_4_;
          uVar34 = auVar28._12_4_;
        }
      }
      uVar21 = uVar21 + 1;
      lVar17 = lVar17 + 0x68;
    } while ((long)iVar15 != uVar21);
  }
  fVar24 = pIVar10->CellPaddingX + pIVar10->CellPaddingX;
  pIVar10->ColumnsAutoFitWidth =
       (float)(~-(uint)(fVar32 <= fVar29) & (uint)fVar32 | (uint)fVar29 & -(uint)(fVar32 <= fVar29))
       + (float)(int)pIVar10->ColumnsEnabledCount * fVar24 +
         pIVar10->OuterPaddingX + pIVar10->OuterPaddingX +
         (float)(pIVar10->ColumnsEnabledCount + -1) *
         (pIVar10->CellSpacingX1 + pIVar10->CellSpacingX2) + fVar31;
  if ((pIVar11 == window) || ((pIVar10->Flags & 0x1000000U) != 0)) {
    cVar8 = pIVar10->LastResizedColumn;
    if (((long)cVar8 != -1) &&
       (((pIVar10->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar10->InstanceInteracted == pIVar10->InstanceCurrent)))) {
      if ((cVar8 < '\0') ||
         (pIVar20 = (pIVar10->Columns).Data + cVar8, (pIVar10->Columns).DataEnd <= pIVar20))
      goto LAB_0019688f;
      fVar24 = fVar24 + pIVar10->MinColumnWidth;
      fVar32 = pIVar20->MaxX;
      if ((pIVar10->InnerClipRect).Min.x <= fVar32) {
        pIVar2 = &(pIVar10->InnerClipRect).Max;
        if (fVar32 < pIVar2->x || fVar32 == pIVar2->x) goto LAB_001964e2;
        fVar24 = fVar24 + (fVar32 - (window->Pos).x);
      }
      else {
        fVar24 = (fVar32 - (window->Pos).x) - fVar24;
      }
      SetScrollFromPosX(window,fVar24,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_001964e2:
  cVar8 = pIVar10->ResizedColumn;
  if (((long)cVar8 != -1) && (pIVar10->InstanceCurrent == pIVar10->InstanceInteracted)) {
    if ((cVar8 < '\0') ||
       (pIVar20 = (pIVar10->Columns).Data + cVar8, (pIVar10->Columns).DataEnd <= pIVar20)) {
LAB_0019688f:
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_internal.h"
                    ,0x255,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    pIVar10->ResizedColumnNextWidth =
         (float)(int)((((((pIVar13->IO).MousePos.x - (pIVar13->ActiveIdClickOffset).x) + 4.0) -
                       pIVar20->MinX) - pIVar10->CellSpacingX1) -
                     (pIVar10->CellPaddingX + pIVar10->CellPaddingX));
  }
  lVar17 = (long)(window->IDStack).Size;
  if (lVar17 < 1) {
    pcVar19 = "T &ImVector<unsigned int>::back() [T = unsigned int]";
LAB_00196956:
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                  ,0x70c,pcVar19);
  }
  if ((window->IDStack).Data[lVar17 + -1] != (int)pIVar10->InstanceCurrent + pIVar10->ID) {
    __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x534,"void ImGui::EndTable()");
  }
  if ((pIVar11->DC).ItemWidthStack.Size < pIVar18->HostBackupItemWidthStackSize) {
    __assert_fail("(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x535,"void ImGui::EndTable()");
  }
  PopID();
  fVar32 = (pIVar11->DC).CursorMaxPos.x;
  fVar29 = (pIVar11->DC).CursorMaxPos.y;
  IVar6 = (pIVar18->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar18->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar6;
  IVar6 = (pIVar18->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar18->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar6;
  window->SkipItems = pIVar10->HostSkipItems;
  (pIVar11->DC).CursorPos = (pIVar10->OuterRect).Min;
  (pIVar11->DC).ItemWidth = pIVar18->HostBackupItemWidth;
  (pIVar11->DC).ItemWidthStack.Size = pIVar18->HostBackupItemWidthStackSize;
  (pIVar11->DC).ColumnsOffset.x = (pIVar18->HostBackupColumnsOffset).x;
  if (pIVar11 == window) {
    IVar6 = (pIVar10->OuterRect).Min;
    IVar7 = (pIVar10->OuterRect).Max;
    local_38.x = IVar7.x - IVar6.x;
    local_38.y = IVar7.y - IVar6.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar10->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    EndChild();
  }
  uVar33 = pIVar10->Flags;
  if ((uVar33 >> 0x10 & 1) == 0) {
    fVar31 = (pIVar18->UserOuterSize).x;
    fVar24 = 0.0;
    if (fVar31 <= 0.0) {
      if ((uVar33 >> 0x18 & 1) != 0) {
        fVar24 = (window->ScrollbarSizes).x;
      }
      fVar30 = (pIVar10->OuterRect).Min.x + pIVar10->ColumnsAutoFitWidth;
      fVar5 = (pIVar11->DC).IdealMaxPos.x;
      fVar31 = (fVar24 + fVar30) - fVar31;
      uVar22 = -(uint)(fVar31 <= fVar5);
      (pIVar11->DC).IdealMaxPos.x = (float)(uVar22 & (uint)fVar5 | ~uVar22 & (uint)fVar31);
      fVar31 = (pIVar10->OuterRect).Max.x;
      if (fVar30 <= fVar31) {
        fVar31 = fVar30;
      }
    }
    else {
      fVar31 = (pIVar10->OuterRect).Max.x;
    }
  }
  else {
    if ((uVar33 >> 0x18 & 1) != 0) {
      __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                    ,0x554,"void ImGui::EndTable()");
    }
    fVar31 = (pIVar10->OuterRect).Min.x + pIVar10->ColumnsAutoFitWidth;
  }
  uVar22 = -(uint)(fVar31 <= fVar32);
  (pIVar11->DC).CursorMaxPos.x = (float)(~uVar22 & (uint)fVar31 | (uint)fVar32 & uVar22);
  fVar32 = (pIVar18->UserOuterSize).y;
  fVar31 = 0.0;
  if (fVar32 <= 0.0) {
    if ((uVar33 >> 0x19 & 1) != 0) {
      fVar31 = (window->ScrollbarSizes).y;
    }
    fVar24 = (pIVar11->DC).IdealMaxPos.y;
    fVar32 = (fVar31 + fVar4) - fVar32;
    uVar33 = -(uint)(fVar32 <= fVar24);
    (pIVar11->DC).IdealMaxPos.y = (float)(uVar33 & (uint)fVar24 | ~uVar33 & (uint)fVar32);
    fVar32 = (pIVar10->OuterRect).Max.y;
    if (fVar4 <= fVar32) {
      fVar32 = fVar4;
    }
  }
  else {
    fVar32 = (pIVar10->OuterRect).Max.y;
  }
  uVar33 = -(uint)(fVar32 <= fVar29);
  (pIVar11->DC).CursorMaxPos.y = (float)(~uVar33 & (uint)fVar32 | (uint)fVar29 & uVar33);
  if (pIVar10->IsSettingsDirty == true) {
    TableSaveSettings(pIVar10);
  }
  pIVar10->IsInitializing = false;
  if ((pIVar13->CurrentWindow != pIVar11) || (pIVar13->CurrentTable != pIVar10)) {
    __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x573,"void ImGui::EndTable()");
  }
  iVar15 = pIVar13->TablesTempDataStacked;
  if (iVar15 < 1) {
    __assert_fail("g.TablesTempDataStacked > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x574,"void ImGui::EndTable()");
  }
  pIVar13->TablesTempDataStacked = iVar15 + -1;
  if (iVar15 == 1) {
LAB_00196869:
    pIVar13->CurrentTable = (ImGuiTable *)0x0;
  }
  else {
    if ((pIVar13->TablesTempData).Size <= (int)(iVar15 - 2U)) {
      pcVar19 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
LAB_00196a3e:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                    ,0x703,pcVar19);
    }
    pIVar18 = (pIVar13->TablesTempData).Data;
    if (pIVar18 == (ImGuiTableTempData *)0x0) goto LAB_00196869;
    pIVar18 = pIVar18 + (iVar15 - 2U);
    iVar15 = pIVar18->TableIndex;
    if (((long)iVar15 < 0) || ((pIVar13->Tables).Buf.Size <= iVar15)) {
      pcVar19 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
      goto LAB_00196a3e;
    }
    pIVar10 = (pIVar13->Tables).Buf.Data;
    p = pIVar10 + iVar15;
    pIVar13->CurrentTable = p;
    if (pIVar10 != (ImGuiTable *)0x0) {
      p->TempData = pIVar18;
      p->DrawSplitter = &pIVar18->DrawSplitter;
      iVar15 = ImPool<ImGuiTable>::GetIndex(&pIVar13->Tables,p);
      goto LAB_00196879;
    }
  }
  iVar15 = -1;
LAB_00196879:
  (pIVar11->DC).CurrentTableIdx = iVar15;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    float auto_fit_width_for_fixed = 0.0f;
    float auto_fit_width_for_stretched = 0.0f;
    float auto_fit_width_for_stretched_min = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            float column_width_request = ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize)) ? column->WidthRequest : TableGetColumnWidthAuto(table, column);
            if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
                auto_fit_width_for_fixed += column_width_request;
            else
                auto_fit_width_for_stretched += column_width_request;
            if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) && (column->Flags & ImGuiTableColumnFlags_NoResize) != 0)
                auto_fit_width_for_stretched_min = ImMax(auto_fit_width_for_stretched_min, column_width_request / (column->StretchWeight / table->ColumnsStretchSumWeights));
        }
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount + auto_fit_width_for_fixed + ImMax(auto_fit_width_for_stretched, auto_fit_width_for_stretched_min);

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}